

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cc
# Opt level: O2

int bio_free(BIO *bio)

{
  long *orig_ptr;
  long lVar1;
  long *plVar2;
  uint __line;
  char *__function;
  void *orig_ptr_00;
  char *__assertion;
  
  orig_ptr = (long *)bio->ptr;
  if (orig_ptr == (long *)0x0) {
    __assertion = "b != NULL";
    __function = "int bio_free(BIO *)";
    __line = 0x5e;
  }
  else {
    lVar1 = *orig_ptr;
    if (lVar1 == 0) {
      orig_ptr_00 = (void *)orig_ptr[5];
LAB_003d15a3:
      OPENSSL_free(orig_ptr_00);
      OPENSSL_free(orig_ptr);
      return 1;
    }
    plVar2 = *(long **)(lVar1 + 0x28);
    if (plVar2 == (long *)0x0) {
      __assertion = "peer_b != NULL";
      __function = "void bio_destroy_pair(BIO *)";
      __line = 0x4b;
    }
    else if ((BIO *)*plVar2 == bio) {
      *plVar2 = 0;
      *(undefined4 *)(lVar1 + 0x10) = 0;
      if (plVar2[5] == 0) {
        __assertion = "peer_b->buf != NULL";
        __function = "void bio_destroy_pair(BIO *)";
        __line = 0x50;
      }
      else {
        plVar2[2] = 0;
        plVar2[3] = 0;
        *orig_ptr = 0;
        bio->init = 0;
        orig_ptr_00 = (void *)orig_ptr[5];
        if (orig_ptr_00 != (void *)0x0) {
          orig_ptr[2] = 0;
          orig_ptr[3] = 0;
          goto LAB_003d15a3;
        }
        __assertion = "b->buf != NULL";
        __function = "void bio_destroy_pair(BIO *)";
        __line = 0x56;
      }
    }
    else {
      __assertion = "peer_b->peer == bio";
      __function = "void bio_destroy_pair(BIO *)";
      __line = 0x4c;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                ,__line,__function);
}

Assistant:

static int bio_free(BIO *bio) {
  struct bio_bio_st *b = reinterpret_cast<bio_bio_st *>(bio->ptr);

  assert(b != NULL);

  if (b->peer) {
    bio_destroy_pair(bio);
  }

  OPENSSL_free(b->buf);
  OPENSSL_free(b);

  return 1;
}